

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O3

void __thiscall PrintfTest_VPrintf_Test::TestBody(PrintfTest_VPrintf_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unsigned_long_long uVar2;
  FILE *pFVar3;
  bool bVar4;
  int iVar5;
  AssertionResult *pAVar6;
  char *pcVar7;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar8;
  undefined8 uVar9;
  ulong uVar10;
  AssertionResult gtest_ar;
  string gtest_expected_output;
  OutputRedirect gtest_redir;
  format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_int>
  as;
  string gtest_output;
  AssertionResult local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  OutputRedirect local_2a0;
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  local_290;
  undefined8 local_258 [2];
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  char local_228 [504];
  
  uVar2 = fmt::v5::
          format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
          ::TYPES;
  local_290.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.field_1.values_ =
       (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        *)local_258;
  local_258[0] = 0x2a;
  local_238._M_allocated_capacity = 0;
  local_248._0_8_ = &PTR_grow_0023bf40;
  local_238._8_8_ = 500;
  local_290.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.data_ = "%d";
  local_290.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.format_str_.size_ = 2;
  local_290.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .parse_context_.next_arg_id_ = 0;
  local_290.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .out_.container = (basic_buffer<char> *)local_248;
  local_290.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .args_.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,int>
       ::TYPES;
  local_290.
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  .loc_.locale_ = (void *)0x0;
  local_248._8_8_ = local_228;
  fmt::v5::
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  ::format(&local_290);
  paVar1 = &local_2c0.field_2;
  local_2c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,local_248._8_8_,
             (char *)(local_248._8_8_ + local_238._M_allocated_capacity));
  local_248._0_8_ = &PTR_grow_0023bf40;
  if ((char *)local_248._8_8_ != local_228) {
    operator_delete((void *)local_248._8_8_);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&local_2d0,"fmt::vsprintf(\"%d\", args)","\"42\"",&local_2c0,
             (char (*) [3])0x202c47);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  if (local_2d0.success_ == false) {
    testing::Message::Message((Message *)local_248);
    if (local_2d0.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_2d0.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x205,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_2d0.success_ == true) {
    local_2c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"42","");
    OutputRedirect::OutputRedirect(&local_2a0,(FILE *)_stdout);
    bVar4 = testing::internal::AlwaysTrue();
    pFVar3 = _stdout;
    if (bVar4) {
      local_238._M_allocated_capacity = 0;
      local_248._0_8_ = &PTR_grow_0023bf40;
      local_238._8_8_ = 500;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_ = "%d";
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.size_ = 2;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.next_arg_id_ = 0;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .out_.container = (basic_buffer<char> *)local_248;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .args_.types_ = uVar2;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .args_.field_1.values_ =
           (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
            *)local_258;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .loc_.locale_ = (void *)0x0;
      local_248._8_8_ = local_228;
      fmt::v5::
      basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
      ::format(&local_290);
      fwrite((void *)local_248._8_8_,1,local_238._M_allocated_capacity,pFVar3);
      local_248._0_8_ = &PTR_grow_0023bf40;
      if ((char *)local_248._8_8_ != local_228) {
        operator_delete((void *)local_248._8_8_);
      }
    }
    OutputRedirect::restore_and_read_abi_cxx11_((string *)local_248,&local_2a0);
    sVar8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_248._0_8_;
    if (local_248._8_8_ == local_2c0._M_string_length) {
      bVar4 = true;
      if ((char *)local_248._8_8_ != (char *)0x0) {
        iVar5 = bcmp((void *)local_248._0_8_,local_2c0._M_dataplus._M_p,local_248._8_8_);
        if (iVar5 != 0) goto LAB_0012c8e1;
      }
    }
    else {
LAB_0012c8e1:
      pAVar6 = testing::AssertionResult::operator<<
                         (&local_2d0,
                          (char (*) [53])"fmt::vprintf(\"%d\", args) produces different output.\n");
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x208855);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,&local_2c0);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [2])0x208f1f);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x208849);
      testing::AssertionResult::operator<<
                (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_248);
      bVar4 = false;
      sVar8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_248._0_8_;
    }
    if (sVar8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (local_248 + 0x10)) {
      operator_delete(sVar8.ptr_);
    }
    OutputRedirect::~OutputRedirect(&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2c0._M_dataplus._M_p);
    }
    if (!bVar4) goto LAB_0012c97e;
  }
  else {
LAB_0012c97e:
    testing::Message::Message((Message *)local_248);
    if (local_2d0.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_2d0.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x206,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_2d0.success_ == true) {
    local_2c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"42","");
    OutputRedirect::OutputRedirect(&local_2a0,(FILE *)_stdout);
    bVar4 = testing::internal::AlwaysTrue();
    pFVar3 = _stdout;
    if (bVar4) {
      local_238._M_allocated_capacity = 0;
      local_248._0_8_ = &PTR_grow_0023bf40;
      local_238._8_8_ = 500;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_ = "%d";
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.size_ = 2;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.next_arg_id_ = 0;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .out_.container = (basic_buffer<char> *)local_248;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .args_.types_ = uVar2;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .args_.field_1.values_ =
           (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
            *)local_258;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .loc_.locale_ = (void *)0x0;
      local_248._8_8_ = local_228;
      fmt::v5::
      basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
      ::format(&local_290);
      fwrite((void *)local_248._8_8_,1,local_238._M_allocated_capacity,pFVar3);
      local_248._0_8_ = &PTR_grow_0023bf40;
      if ((char *)local_248._8_8_ != local_228) {
        operator_delete((void *)local_248._8_8_);
      }
    }
    OutputRedirect::restore_and_read_abi_cxx11_((string *)local_248,&local_2a0);
    sVar8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_248._0_8_;
    if (local_248._8_8_ == local_2c0._M_string_length) {
      bVar4 = true;
      if ((char *)local_248._8_8_ != (char *)0x0) {
        iVar5 = bcmp((void *)local_248._0_8_,local_2c0._M_dataplus._M_p,local_248._8_8_);
        if (iVar5 != 0) goto LAB_0012cb47;
      }
    }
    else {
LAB_0012cb47:
      pAVar6 = testing::AssertionResult::operator<<
                         (&local_2d0,
                          (char (*) [62])
                          "fmt::vfprintf(stdout, \"%d\", args) produces different output.\n");
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x208855);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,&local_2c0);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [2])0x208f1f);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x208849);
      testing::AssertionResult::operator<<
                (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_248);
      bVar4 = false;
      sVar8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_248._0_8_;
    }
    if (sVar8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (local_248 + 0x10)) {
      operator_delete(sVar8.ptr_);
    }
    OutputRedirect::~OutputRedirect(&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2c0._M_dataplus._M_p);
    }
    if (!bVar4) goto LAB_0012cbe4;
  }
  else {
LAB_0012cbe4:
    testing::Message::Message((Message *)local_248);
    if (local_2d0.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_2d0.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x207,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_2d0.success_ == true) {
    local_2c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"42","");
    OutputRedirect::OutputRedirect(&local_2a0,(FILE *)_stdout);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      local_238._M_allocated_capacity = 0;
      local_248._0_8_ = &PTR_grow_0023bf40;
      local_238._8_8_ = 500;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.data_ = "%d";
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.format_str_.size_ = 2;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .parse_context_.next_arg_id_ = 0;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .out_.container = (basic_buffer<char> *)local_248;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .args_.types_ = uVar2;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .args_.field_1.values_ =
           (value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
            *)local_258;
      local_290.
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
      .loc_.locale_ = (void *)0x0;
      local_248._8_8_ = local_228;
      fmt::v5::
      basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
      ::format(&local_290);
      pcVar7 = (char *)local_248._8_8_;
      uVar9 = local_238._M_allocated_capacity;
      do {
        uVar10 = 0x7fffffffffffffff;
        if ((ulong)uVar9 < 0x7fffffffffffffff) {
          uVar10 = uVar9;
        }
        std::ostream::write((char *)&std::cout,(long)pcVar7);
        pcVar7 = pcVar7 + uVar10;
        uVar9 = uVar9 - uVar10;
      } while (uVar9 != 0);
      local_248._0_8_ = &PTR_grow_0023bf40;
      if ((char *)local_248._8_8_ != local_228) {
        operator_delete((void *)local_248._8_8_);
      }
    }
    OutputRedirect::restore_and_read_abi_cxx11_((string *)local_248,&local_2a0);
    sVar8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_248._0_8_;
    if (local_248._8_8_ == local_2c0._M_string_length) {
      bVar4 = true;
      if ((char *)local_248._8_8_ != (char *)0x0) {
        iVar5 = bcmp((void *)local_248._0_8_,local_2c0._M_dataplus._M_p,local_248._8_8_);
        if (iVar5 != 0) goto LAB_0012cdda;
      }
    }
    else {
LAB_0012cdda:
      pAVar6 = testing::AssertionResult::operator<<
                         (&local_2d0,
                          (char (*) [65])
                          "fmt::vfprintf(std::cout, \"%d\", args) produces different output.\n");
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x208855);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,&local_2c0);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [2])0x208f1f);
      pAVar6 = testing::AssertionResult::operator<<(pAVar6,(char (*) [11])0x208849);
      testing::AssertionResult::operator<<
                (pAVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_248);
      bVar4 = false;
      sVar8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_248._0_8_;
    }
    if (sVar8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (local_248 + 0x10)) {
      operator_delete(sVar8.ptr_);
    }
    OutputRedirect::~OutputRedirect(&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p);
    }
    if (bVar4) goto LAB_0012cefc;
  }
  testing::Message::Message((Message *)local_248);
  if (local_2d0.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar7 = "";
  }
  else {
    pcVar7 = ((local_2d0.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_290,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
             ,0x208,pcVar7);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)local_248);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(_func_int **)local_248._0_8_ + 8))();
    }
  }
LAB_0012cefc:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2d0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

TEST(PrintfTest, VPrintf) {
  fmt::format_arg_store<fmt::printf_context, int> as{42};
  fmt::basic_format_args<fmt::printf_context> args(as);
  EXPECT_EQ(fmt::vsprintf("%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vprintf("%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vfprintf(stdout, "%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vfprintf(std::cout, "%d", args), "42");
}